

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_rect.cxx
# Opt level: O1

void __thiscall
Fl_Graphics_Driver::polygon
          (Fl_Graphics_Driver *this,int x,int y,int x1,int y1,int x2,int y2,int x3,int y3)

{
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  undefined2 local_30;
  undefined2 local_2e;
  undefined2 local_2c;
  undefined2 local_2a;
  undefined2 local_28;
  undefined2 local_26;
  
  local_38 = (undefined2)x;
  local_36 = (undefined2)y;
  local_34 = (undefined2)x1;
  local_32 = (undefined2)y1;
  local_30 = (undefined2)x2;
  local_2e = (undefined2)y2;
  local_2c = (undefined2)x3;
  local_2a = (undefined2)y3;
  local_28 = local_38;
  local_26 = local_36;
  XFillPolygon(fl_display,fl_window,fl_gc,&local_38,4,2,0);
  XDrawLines(fl_display,fl_window,fl_gc,&local_38,5,0);
  return;
}

Assistant:

void Fl_Graphics_Driver::polygon(int x, int y, int x1, int y1, int x2, int y2, int x3, int y3) {
  XPoint p[5];
  p[0].x = x;  p[0].y = y;
  p[1].x = x1; p[1].y = y1;
  p[2].x = x2; p[2].y = y2;
  p[3].x = x3; p[3].y = y3;
#if defined(USE_X11)
  p[4].x = x;  p[4].y = y;
  XFillPolygon(fl_display, fl_window, fl_gc, p, 4, Convex, 0);
  XDrawLines(fl_display, fl_window, fl_gc, p, 5, 0);
#elif defined(WIN32)
  SelectObject(fl_gc, fl_brush());
  Polygon(fl_gc, p, 4);
#elif defined(__APPLE_QUARTZ__)
  CGContextSetShouldAntialias(fl_gc, true);
  CGContextMoveToPoint(fl_gc, x, y);
  CGContextAddLineToPoint(fl_gc, x1, y1);
  CGContextAddLineToPoint(fl_gc, x2, y2);
  CGContextAddLineToPoint(fl_gc, x3, y3);
  CGContextClosePath(fl_gc);
  CGContextFillPath(fl_gc);
  CGContextSetShouldAntialias(fl_gc, false);
#else
# error unsupported platform
#endif
}